

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O2

void __thiscall GibbsSamplerFromHDP::countN(GibbsSamplerFromHDP *this)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer puVar7;
  int j_1;
  int k;
  pointer puVar8;
  pointer puVar9;
  uint uVar10;
  ulong uVar11;
  int i_1;
  int iVar12;
  int *piVar13;
  int j;
  ulong uVar14;
  int j_2;
  
  fillMatrix<unsigned_int>(&this->_njt,0);
  fillTensor<unsigned_int>(&this->_njtv,0);
  puVar7 = (this->_nj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar14 = 0; uVar11 = (ulong)this->_J, uVar14 < uVar11; uVar14 = uVar14 + 1) {
    pvVar1 = (this->_tji).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->_xji).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (this->_njtv).
             super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar11 = 0; uVar11 < puVar7[uVar14]; uVar11 = uVar11 + 1) {
      piVar13 = (int *)(*(long *)(*(long *)&pvVar3[uVar14].
                                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                            ._M_impl.super__Vector_impl_data +
                                 (ulong)*(uint *)(*(long *)&pvVar1[uVar14].
                                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + uVar11 * 4) *
                                 0x18) +
                       (ulong)*(uint *)(*(long *)&pvVar2[uVar14].
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + uVar11 * 4) * 4
                       );
      *piVar13 = *piVar13 + 1;
    }
  }
  puVar7 = (this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar14 = 0; uVar14 < uVar11; uVar14 = uVar14 + 1) {
    pvVar3 = (this->_njtv).
             super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = (this->_njt).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar11 = 0; uVar11 < puVar7[uVar14]; uVar11 = uVar11 + 1) {
      lVar4 = *(long *)&pvVar3[uVar14].
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      iVar12 = 0;
      for (piVar13 = *(int **)(lVar4 + uVar11 * 0x18);
          piVar13 != *(int **)(lVar4 + 8 + uVar11 * 0x18); piVar13 = piVar13 + 1) {
        iVar12 = iVar12 + *piVar13;
      }
      *(int *)(*(long *)&pvVar1[uVar14].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + uVar11 * 4) = iVar12;
    }
    uVar11 = (ulong)this->_J;
  }
  puVar9 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar7 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar7 != puVar9; puVar7 = puVar7 + 1) {
    *puVar7 = 0;
  }
  fillMatrix<unsigned_int>(&this->_nkv,0);
  puVar7 = (this->_nj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar14 = 0; uVar14 < this->_J; uVar14 = uVar14 + 1) {
    pvVar1 = (this->_tji).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->_kjt).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (this->_xji).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (this->_nkv).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar11 = 0; uVar11 < puVar7[uVar14]; uVar11 = uVar11 + 1) {
      piVar13 = (int *)(*(long *)&pvVar6[*(uint *)(*(long *)&pvVar2[uVar14].
                                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data +
                                                  (ulong)*(uint *)(*(long *)&pvVar1[uVar14].
                                                                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + uVar11 * 4) * 4
                                                  )].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data +
                       (ulong)*(uint *)(*(long *)&pvVar5[uVar14].
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + uVar11 * 4) * 4
                       );
      *piVar13 = *piVar13 + 1;
    }
  }
  puVar7 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar1 = (this->_nkv).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar14 = 0; uVar14 < this->_K; uVar14 = uVar14 + 1) {
    uVar10 = 0;
    for (puVar9 = pvVar1[uVar14].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar9 != *(pointer *)
                   ((long)&pvVar1[uVar14].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data + 8); puVar9 = puVar9 + 1) {
      uVar10 = uVar10 + *puVar9;
    }
    puVar7[uVar14] = uVar10;
  }
  puVar9 = (this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar7 = (this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar8 = puVar7; puVar8 != puVar9; puVar8 = puVar8 + 1) {
    *puVar8 = 0;
  }
  puVar9 = (this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar14 = 0; uVar14 < this->_J; uVar14 = uVar14 + 1) {
    pvVar1 = (this->_kjt).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar11 = 0; uVar11 < puVar9[uVar14]; uVar11 = uVar11 + 1) {
      puVar8 = puVar7 + *(uint *)(*(long *)&pvVar1[uVar14].
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data + uVar11 * 4);
      *puVar8 = *puVar8 + 1;
    }
  }
  return;
}

Assistant:

void GibbsSamplerFromHDP::countN(){//{{{
    // count njt from tji
    fillMatrix(_njt, 0u);
    fillTensor(_njtv, 0u);
    for(int j=0; j<_J; j++){
        for(int i=0; i<_nj[j]; i++){
            unsigned int t = _tji[j][i];
            unsigned int v = _xji[j][i];
            _njtv[j][t][v]++;
        }
    }
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            _njt[j][t] = accumulate(_njtv[j][t].begin(), _njtv[j][t].end(), 0u);
        }
    }
    // delete t & update tji
    // count njt from tji
    fill(_nk.begin(), _nk.end(), 0);
    // count nkv from kjtji & xji
    fillMatrix(_nkv, 0u);
    for(int j=0; j<_J; j++){
        for(int i=0; i<_nj[j]; i++){
            unsigned int t = _tji[j][i];
            unsigned int k = _kjt[j][t];
            unsigned int v = _xji[j][i];
            _nkv[k][v]++;
        }
    }
    for(int k=0; k<_K; k++){
        _nk[k] = accumulate(_nkv[k].begin(), _nkv[k].end(), 0u);
    }
    fill(_mk.begin(), _mk.end(), 0);
    // mk
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            _mk[_kjt[j][t]]++;
        }
    }
}